

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSetTest_PartialSimple_Test::
TestBody(MessageDifferencerTest_RepeatedFieldSetTest_PartialSimple_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  FieldDescriptor *field;
  char *in_R9;
  TestDiffMessage a;
  TestDiffMessage c;
  TestDiffMessage b;
  MessageDifferencer differencer;
  AssertHelper local_430;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_428;
  internal local_420 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  string local_410;
  undefined1 local_3f0 [184];
  undefined1 local_338 [184];
  undefined1 local_280 [184];
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_3f0,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_280,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_338,(Arena *)0x0);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_3f0 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_3f0 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 0;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_280 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
            ((RepeatedPtrFieldBase *)(local_280 + 0x70),
             Arena::DefaultConstruct<proto2_unittest::TestField>);
  protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
            ((RepeatedPtrFieldBase *)(local_338 + 0x70),
             Arena::DefaultConstruct<proto2_unittest::TestField>);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_338 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  util::MessageDifferencer::set_scope(&local_1c8,PARTIAL);
  paVar1 = &local_410.field_2;
  local_410._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"rm","");
  field = GetFieldDescriptor((anon_unknown_0 *)local_3f0,(Message *)local_410._M_dataplus._M_p,
                             (string *)local_410._M_string_length);
  util::MessageDifferencer::TreatAsSet(&local_1c8,field);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != paVar1) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  local_420[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c8,(Message *)local_280,(Message *)local_3f0);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_420[0]) {
    testing::Message::Message((Message *)&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_410,local_420,(AssertionResult *)"differencer.Compare(b, a)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x828,local_410._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_430,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if (local_428._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_428._M_head_impl + 8))();
    }
    if (local_418 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_418,local_418);
    }
  }
  local_420[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c8,(Message *)local_338,(Message *)local_3f0);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_420[0]) {
    testing::Message::Message((Message *)&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_410,local_420,(AssertionResult *)"differencer.Compare(c, a)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x829,local_410._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_430,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if (local_428._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_428._M_head_impl + 8))();
    }
    if (local_418 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_418,local_418);
    }
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_338);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_280);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_3f0);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSetTest_PartialSimple) {
  proto2_unittest::TestDiffMessage a, b, c;
  // message a: {
  //   rm { c: 1 }
  //   rm { c: 0 }
  // }
  a.add_rm()->set_c(1);
  a.add_rm()->set_c(0);
  // message b: {
  //   rm { c: 1 }
  //   rm {}
  // }
  b.add_rm()->set_c(1);
  b.add_rm();
  // message c: {
  //   rm {}
  //   rm { c: 1 }
  // }
  c.add_rm();
  c.add_rm()->set_c(1);
  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.TreatAsSet(GetFieldDescriptor(a, "rm"));
  EXPECT_TRUE(differencer.Compare(b, a));
  EXPECT_TRUE(differencer.Compare(c, a));
}